

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleMumpsCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  bool bVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  int iVar8;
  string coverageFile;
  cmParseCacheCoverage ccov;
  ostringstream cmCTestLog_msg;
  cmParseGTMCoverage cov;
  string local_270;
  string local_250;
  undefined1 local_230 [16];
  _func_int *local_220 [7];
  undefined1 local_1e8 [112];
  ios_base local_178 [264];
  cmParseMumpsCoverage local_70;
  
  cmParseGTMCoverage::cmParseGTMCoverage
            ((cmParseGTMCoverage *)&local_70,cont,(this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_((string *)local_1e8,(this->super_cmCTestGenericHandler).CTest);
  plVar5 = (long *)std::__cxx11::string::append(local_1e8);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_270.field_2._M_allocated_capacity = *psVar7;
    local_270.field_2._8_8_ = plVar5[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar7;
    local_270._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_270._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar2 = local_1e8 + 0x10;
  if ((pointer)local_1e8._0_8_ != pcVar2) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  bVar4 = cmsys::SystemTools::FileExists(&local_270);
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Parsing Cache Coverage: ",0x18);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e8,local_270._M_dataplus._M_p,local_270._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2f7,(char *)local_230._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((_func_int **)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,(ulong)(local_220[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    cmParseMumpsCoverage::ReadCoverageFile(&local_70,local_270._M_dataplus._M_p);
    iVar8 = (int)(cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8," Cannot find GTM coverage file: ",0x20);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e8,local_270._M_dataplus._M_p,local_270._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2fe,(char *)local_230._0_8_,(this->super_cmCTestGenericHandler).Quiet);
    if ((_func_int **)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,(ulong)(local_220[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    cmParseCacheCoverage::cmParseCacheCoverage
              ((cmParseCacheCoverage *)local_230,cont,(this->super_cmCTestGenericHandler).CTest);
    cmCTest::GetBinaryDir_abi_cxx11_(&local_250,(this->super_cmCTestGenericHandler).CTest);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_1e8._16_8_ = *psVar7;
      local_1e8._24_8_ = plVar5[3];
      local_1e8._0_8_ = pcVar2;
    }
    else {
      local_1e8._16_8_ = *psVar7;
      local_1e8._0_8_ = (size_type *)*plVar5;
    }
    local_1e8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_270,(string *)local_1e8);
    if ((pointer)local_1e8._0_8_ != pcVar2) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    paVar1 = &local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar1) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists(&local_270);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Parsing Cache Coverage: ",0x18);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e8,local_270._M_dataplus._M_p,local_270._M_string_length
                         );
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x304,local_250._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
      cmParseMumpsCoverage::ReadCoverageFile
                ((cmParseMumpsCoverage *)local_230,local_270._M_dataplus._M_p);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8," Cannot find Cache coverage file: ",0x22);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1e8,local_270._M_dataplus._M_p,local_270._M_string_length
                         );
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x30a,local_250._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
    }
    iVar8 = (int)(cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    cmParseMumpsCoverage::~cmParseMumpsCoverage((cmParseMumpsCoverage *)local_230);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  cmParseMumpsCoverage::~cmParseMumpsCoverage(&local_70);
  return iVar8;
}

Assistant:

int cmCTestCoverageHandler::HandleMumpsCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  // try gtm coverage
  cmParseGTMCoverage cov(*cont, this->CTest);
  std::string coverageFile =
    this->CTest->GetBinaryDir() + "/gtm_coverage.mcov";
  if (cmSystemTools::FileExists(coverageFile)) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Parsing Cache Coverage: " << coverageFile << std::endl,
                       this->Quiet);
    cov.ReadCoverageFile(coverageFile.c_str());
    return static_cast<int>(cont->TotalCoverage.size());
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " Cannot find GTM coverage file: " << coverageFile
                                                        << std::endl,
                     this->Quiet);
  cmParseCacheCoverage ccov(*cont, this->CTest);
  coverageFile = this->CTest->GetBinaryDir() + "/cache_coverage.cmcov";
  if (cmSystemTools::FileExists(coverageFile)) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Parsing Cache Coverage: " << coverageFile << std::endl,
                       this->Quiet);
    ccov.ReadCoverageFile(coverageFile.c_str());
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find Cache coverage file: " << coverageFile
                                                            << std::endl,
                       this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}